

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O0

void __thiscall SceneParser::parseMaterials(SceneParser *this)

{
  int iVar1;
  Material *local_88;
  int local_7c;
  char local_78 [4];
  int count;
  char token [100];
  SceneParser *this_local;
  
  unique0x1000024b = this;
  getToken(this,local_78);
  iVar1 = strcmp(local_78,"{");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0xb0,"void SceneParser::parseMaterials()");
  }
  getToken(this,local_78);
  iVar1 = strcmp(local_78,"numMaterials");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"numMaterials\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0xb4,"void SceneParser::parseMaterials()");
  }
  iVar1 = readInt(this);
  this->_num_materials = iVar1;
  local_7c = 0;
  do {
    if (this->_num_materials <= local_7c) {
      getToken(this,local_78);
      iVar1 = strcmp(local_78,"}");
      if (iVar1 != 0) {
        __assert_fail("!strcmp(token, \"}\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                      ,0xc5,"void SceneParser::parseMaterials()");
      }
      return;
    }
    getToken(this,local_78);
    iVar1 = strcmp(local_78,"Material");
    if (iVar1 != 0) {
      iVar1 = strcmp(local_78,"PhongMaterial");
      if (iVar1 != 0) {
        printf("Unknown token in parseMaterial: \'%s\'\n",local_78);
        exit(0);
      }
    }
    local_88 = parseMaterial(this);
    std::vector<Material_*,_std::allocator<Material_*>_>::push_back(&this->_materials,&local_88);
    local_7c = local_7c + 1;
  } while( true );
}

Assistant:

void
SceneParser::parseMaterials() {
    // Ensure the structure is valid.
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));

    // Read in the number of objects.
    getToken(token);
    assert(!strcmp(token, "numMaterials"));
    _num_materials = readInt();

    // Read in the objects.
    int count = 0;
    while (_num_materials > count) {
        getToken(token);
        if (!strcmp(token, "Material") ||
            !strcmp(token, "PhongMaterial")) {
            _materials.push_back(parseMaterial());
        } else {
            printf("Unknown token in parseMaterial: '%s'\n", token);
            exit(0);
        }
        count++;
    }
    getToken(token);
    assert(!strcmp(token, "}"));
}